

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O0

int bfgs_l_min(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,int m,double *dx,
              double fsval,double maxstep,int MAXITER,int *niter,double eps,double gtol,double ftol,
              double xtol,double *xf)

{
  bool bVar1;
  double dVar2;
  double *f;
  double *array;
  double *xi_00;
  double *r;
  double *H_00;
  void *__ptr;
  double *sk_00;
  double *yk_00;
  double *tsk_00;
  double *tyk_00;
  double eps2_00;
  double *tyk;
  double *tsk;
  double *yk;
  double *sk;
  double *jacf;
  double *step;
  double *H;
  double *xc;
  double *scheck;
  double *jac;
  double eps2;
  double fxf;
  double stop0;
  double den;
  double num;
  double fx;
  double fo;
  double alpha;
  double dt2;
  double dt1;
  int iter;
  int ptr;
  int retval;
  int siter;
  int j;
  int i;
  int gfdcode;
  int rcode;
  double xtol_local;
  double ftol_local;
  double gtol_local;
  double eps_local;
  double maxstep_local;
  double fsval_local;
  double *dx_local;
  int m_local;
  int N_local;
  double *xi_local;
  custom_gradient *funcgrad_local;
  custom_function *funcpt_local;
  
  _gfdcode = xtol;
  xtol_local = ftol;
  ftol_local = gtol;
  gtol_local = eps;
  eps_local = maxstep;
  maxstep_local = fsval;
  fsval_local = (double)dx;
  dx_local._0_4_ = m;
  dx_local._4_4_ = N;
  _m_local = xi;
  xi_local = (double *)funcgrad;
  funcgrad_local = (custom_gradient *)funcpt;
  f = (double *)malloc((long)N << 3);
  array = (double *)malloc((long)dx_local._4_4_ << 3);
  xi_00 = (double *)malloc((long)dx_local._4_4_ << 3);
  r = (double *)malloc((long)dx_local._4_4_ << 3);
  H_00 = (double *)malloc((long)dx_local._4_4_ * 8 * (long)dx_local._4_4_);
  __ptr = malloc((long)dx_local._4_4_ << 3);
  sk_00 = (double *)malloc((long)(int)dx_local * 8 * (long)dx_local._4_4_);
  yk_00 = (double *)malloc((long)(int)dx_local * 8 * (long)dx_local._4_4_);
  tsk_00 = (double *)malloc((long)dx_local._4_4_ << 3);
  tyk_00 = (double *)malloc((long)dx_local._4_4_ << 3);
  i = 0;
  *niter = 0;
  ptr = MAXITER;
  eps2_00 = sqrt(gtol_local);
  fo = 1.0;
  j = 0;
  for (siter = 0; siter < dx_local._4_4_; siter = siter + 1) {
    _m_local[siter] = *(double *)((long)fsval_local + (long)siter * 8) * _m_local[siter];
    *(double *)((long)fsval_local + (long)siter * 8) =
         1.0 / *(double *)((long)fsval_local + (long)siter * 8);
  }
  num = (double)(*funcgrad_local->funcgrad)
                          (_m_local,dx_local._4_4_,(double *)funcgrad_local->params,funcgrad_local);
  if ((1.79769313486232e+308 <= num) || (num <= -1.79769313486232e+308)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    i = 0xf;
  }
  if (NAN(num)) {
    printf("Program Exiting as the function returns NaN");
    i = 0xf;
  }
  fx = num;
  j = grad_fd((custom_function *)funcgrad_local,(custom_gradient *)xi_local,_m_local,dx_local._4_4_,
              (double *)fsval_local,eps2_00,f);
  if (j == 0xf) {
    i = 0xf;
  }
  if (eps_local <= 0.0) {
    eps_local = 1000.0;
    alpha = 0.0;
    dt2 = 0.0;
    for (siter = 0; siter < dx_local._4_4_; siter = siter + 1) {
      dt2 = *(double *)((long)fsval_local + (long)siter * 8) *
            *(double *)((long)fsval_local + (long)siter * 8) + dt2;
      alpha = *(double *)((long)fsval_local + (long)siter * 8) * _m_local[siter] *
              *(double *)((long)fsval_local + (long)siter * 8) * _m_local[siter] + alpha;
    }
    dt2 = sqrt(dt2);
    alpha = sqrt(alpha);
    dVar2 = alpha;
    if (alpha < dt2) {
      dVar2 = dt2;
    }
    eps_local = dVar2 * eps_local;
  }
  dVar2 = maxstep_local;
  if (ABS(maxstep_local) < ABS(num)) {
    dVar2 = num;
  }
  stop0 = ABS(dVar2);
  for (siter = 0; siter < dx_local._4_4_; siter = siter + 1) {
    if (ABS(_m_local[siter]) <= 1.0 / ABS(*(double *)((long)fsval_local + (long)siter * 8))) {
      den = 1.0 / ABS(*(double *)((long)fsval_local + (long)siter * 8));
    }
    else {
      den = ABS(_m_local[siter]);
    }
    array[siter] = (ABS(f[siter]) * den) / stop0;
  }
  fxf = array_max_abs(array,dx_local._4_4_);
  if (fxf <= ftol_local * 0.001) {
    i = 1;
    for (siter = 0; siter < dx_local._4_4_; siter = siter + 1) {
      xf[siter] = _m_local[siter];
    }
  }
  for (siter = 0; siter < dx_local._4_4_; siter = siter + 1) {
    xi_00[siter] = _m_local[siter];
  }
  eps2 = num;
  for (siter = 0; siter < dx_local._4_4_; siter = siter + 1) {
    tsk_00[siter] = 0.0;
    tyk_00[siter] = 0.0;
  }
  while( true ) {
    bVar1 = false;
    if (i == 0) {
      bVar1 = *niter < ptr;
    }
    if (!bVar1) break;
    dt1._0_4_ = *niter;
    inithess_l(H_00,dx_local._4_4_,dt1._0_4_,tsk_00,tyk_00,(double *)fsval_local);
    bfgs_rec(H_00,dx_local._4_4_,dt1._0_4_,(int)dx_local,f,sk_00,yk_00,r);
    scale(r,1,dx_local._4_4_,-1.0);
    for (siter = 0; siter < dx_local._4_4_; siter = siter + 1) {
      *(double *)((long)__ptr + (long)siter * 8) = f[siter];
    }
    iter = lnsrchmt((custom_function *)funcgrad_local,(custom_gradient *)xi_local,xi_00,&eps2,f,&fo,
                    r,dx_local._4_4_,(double *)fsval_local,eps_local,MAXITER,eps2_00,xtol_local,
                    ftol_local,_gfdcode,xf);
    i = stopcheck2_mt(eps2,dx_local._4_4_,fx,f,(double *)fsval_local,gtol_local,ftol_local,
                      xtol_local,iter);
    fx = eps2;
    for (siter = 0; siter < dx_local._4_4_; siter = siter + 1) {
      tsk_00[siter] = xf[siter] - xi_00[siter];
      tyk_00[siter] = f[siter] - *(double *)((long)__ptr + (long)siter * 8);
    }
    if (*niter < (int)dx_local) {
      dt1._4_4_ = *niter * dx_local._4_4_;
      for (siter = 0; siter < dx_local._4_4_; siter = siter + 1) {
        sk_00[dt1._4_4_ + siter] = tsk_00[siter];
        yk_00[dt1._4_4_ + siter] = tyk_00[siter];
      }
    }
    else {
      for (siter = 0; siter < ((int)dx_local + -1) * dx_local._4_4_; siter = siter + 1) {
        sk_00[siter] = sk_00[dx_local._4_4_ + siter];
        yk_00[siter] = yk_00[dx_local._4_4_ + siter];
      }
      retval = 0;
      for (siter = ((int)dx_local + -1) * dx_local._4_4_; siter < (int)dx_local * dx_local._4_4_;
          siter = siter + 1) {
        sk_00[siter] = tsk_00[retval];
        yk_00[siter] = tyk_00[retval];
        retval = retval + 1;
      }
    }
    for (siter = 0; siter < dx_local._4_4_; siter = siter + 1) {
      xi_00[siter] = xf[siter];
      r[siter] = 0.0;
    }
    *niter = *niter + 1;
  }
  if ((i == 0) && (ptr <= *niter)) {
    i = 4;
  }
  for (siter = 0; siter < dx_local._4_4_; siter = siter + 1) {
    _m_local[siter] = *(double *)((long)fsval_local + (long)siter * 8) * _m_local[siter];
    *(double *)((long)fsval_local + (long)siter * 8) =
         1.0 / *(double *)((long)fsval_local + (long)siter * 8);
  }
  free(f);
  free(array);
  free(xi_00);
  free(H_00);
  free(r);
  free(__ptr);
  free(sk_00);
  free(yk_00);
  free(tsk_00);
  free(tyk_00);
  return i;
}

Assistant:

int bfgs_l_min(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, int m, double *dx, double fsval,double maxstep, int MAXITER, int *niter,
		double eps,double gtol,double ftol,double xtol,double *xf)  {
	int rcode,gfdcode;
	int i,j,siter,retval;
	int ptr,iter;
	double dt1,dt2,alpha,fo;
	double fx,num,den,stop0,fxf,eps2;
	double *jac,*scheck,*xc,*H,*step,*jacf,*sk,*yk,*tsk,*tyk;

	jac = (double*) malloc(sizeof(double) *N);
	scheck = (double*) malloc(sizeof(double) *N);
	xc = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	H = (double*) malloc(sizeof(double) *N * N);
	jacf = (double*) malloc(sizeof(double) *N);
	sk = (double*) malloc(sizeof(double) * m * N);
	yk = (double*) malloc(sizeof(double) * m * N);
	tsk = (double*) malloc(sizeof(double) *N);
	tyk = (double*) malloc(sizeof(double) *N);

	/*
	 * Return Codes
	 *
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 *
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 *
	 */

	rcode = 0;
	*niter = 0;
	siter = MAXITER;
	eps2 = sqrt(eps);

	alpha = 1.0;
	gfdcode = 0;
	
	//set values
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt, xi, N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}
	fo = fx;

	gfdcode = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,jac);
	if (gfdcode == 15) {
		rcode = 15;
	}

	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);

		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}


	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}

	stop0 = array_max_abs(scheck,N);

	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for(i = 0; i < N;++i) {
			xf[i] = xi[i];
		}
	}

	//hessian_fd(funcpt,xi,N,dx,hess);
	//inithess_lower(L,N,fx,fsval,dx);

	for(i = 0; i < N;++i) {
		xc[i] = xi[i];
	}
	fxf = fx;

	for (i = 0; i < N; ++i) {
		tsk[i] = 0.0;
		tyk[i] = 0.0;
	}


	while (rcode == 0 && *niter < siter) {
		iter = *niter;
		inithess_l(H,N,iter,tsk,tyk,dx);

		bfgs_rec(H,N,iter,m,jac,sk,yk,step);
		//mdisplay(step,1,N);

		scale(step,1,N,-1.0);

		for (i = 0; i < N; ++i) {
			jacf[i] = jac[i];
		}

		//linsolve_lower(L,N,jac,step);

		//scale(jac,1,N,-1.0);
		//retval = lnsrchmod(funcpt,xc,jac,step,N,dx,maxstep,stol,xf,jacf);
		retval = lnsrchmt(funcpt,funcgrad, xc, &fxf, jac, &alpha, step, N, dx, maxstep,MAXITER,eps2,ftol, gtol, xtol, xf);
		//retval = lnsrch(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);

		//retval = swolfe(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);
		//printf("%g %g \n",fo,fxf);

		//grad_fd(funcpt,xf,N,dx,jacf);
		//rcode = stopcheck_mt(fxf, N, xc, xf, jac, dx, fsval, gtol, ftol, retval);
		rcode = stopcheck2_mt(fxf,N,fo,jac,dx,eps,gtol,ftol,retval);
		//rcode = stopcheck3_mt(xc,xf,fxf,N,fo,jac,dx,eps,gtol,ftol,retval);
		//printf("\n CODE %d", rcode);
		fo = fxf;
		for (i = 0; i < N;++i) {
			tsk[i] = xf[i] - xc[i];
			tyk[i] = jac[i] - jacf[i];
		}

		if (*niter >= m) {
			for (i = 0; i < (m-1) * N; ++i) {
				sk[i] = sk[N + i];
				yk[i] = yk[N + i];
			}
			j = 0;

			for (i = (m - 1) * N; i < m * N; ++i) {
				sk[i] = tsk[j];
				yk[i] = tyk[j];
				j++;
			}

		} else {
			ptr = *niter * N;

			for (i = 0; i < N;++i) {
				sk[ptr + i] = tsk[i];
				yk[ptr + i] = tyk[i];
			}

		}

		
		for(i = 0; i < N;++i) {
			xc[i] = xf[i];
			step[i] = 0.0;
		}
		*niter = *niter + 1;

	}

	//mdisplay(xc, 1, N);

	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}
	
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	


	free(jac);
	free(scheck);
	free(xc);
	free(H);
	free(step);
	free(jacf);
	free(sk);
	free(yk);
	free(tsk);
	free(tyk);
	return rcode;
}